

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modm-donna-64bit.h
# Opt level: O3

void reduce256_modm(bignum256modm_element_t *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  
  uVar1 = *r;
  uVar2 = r[1];
  uVar7 = uVar1 + 0xffed9ce5a30a2c13 >> 0x3f;
  uVar8 = uVar2 - (uVar7 | 0xf9dea2f79cd658);
  uVar9 = uVar8 >> 0x3f;
  uVar3 = r[2];
  lVar10 = uVar3 - (uVar9 | 0x14de);
  lVar6 = lVar10 >> 0x3f;
  uVar4 = r[3];
  uVar12 = uVar4 + lVar6;
  uVar13 = uVar12 >> 0x3f;
  uVar5 = r[4];
  lVar11 = uVar5 - (uVar13 | 0x10000000);
  lVar14 = -(lVar11 >> 0x3f);
  uVar15 = lVar14 - 1;
  *r = ((uVar7 << 0x38) + uVar1 + 0xffed9ce5a30a2c13 ^ uVar1) & uVar15 ^ uVar1;
  r[1] = ((uVar9 << 0x38) + uVar8 ^ uVar2) & uVar15 ^ uVar2;
  r[2] = ((-lVar6 << 0x38) + lVar10 ^ uVar3) & uVar15 ^ uVar3;
  r[3] = ((uVar13 << 0x38) + uVar12 ^ uVar4) & uVar15 ^ uVar4;
  r[4] = ((lVar14 << 0x20) + lVar11 ^ uVar5) & uVar15 ^ uVar5;
  return;
}

Assistant:

static void
reduce256_modm(bignum256modm r) {
	bignum256modm t;
	bignum256modm_element_t b = 0, pb, mask;

	/* t = r - m */
	pb = 0;
	pb += modm_m[0]; b = lt_modm(r[0], pb); t[0] = (r[0] - pb + (b << 56)); pb = b;
	pb += modm_m[1]; b = lt_modm(r[1], pb); t[1] = (r[1] - pb + (b << 56)); pb = b;
	pb += modm_m[2]; b = lt_modm(r[2], pb); t[2] = (r[2] - pb + (b << 56)); pb = b;
	pb += modm_m[3]; b = lt_modm(r[3], pb); t[3] = (r[3] - pb + (b << 56)); pb = b;
	pb += modm_m[4]; b = lt_modm(r[4], pb); t[4] = (r[4] - pb + (b << 32)); 

	/* keep r if r was smaller than m */
	mask = b - 1;

	r[0] ^= mask & (r[0] ^ t[0]);
	r[1] ^= mask & (r[1] ^ t[1]);
	r[2] ^= mask & (r[2] ^ t[2]);
	r[3] ^= mask & (r[3] ^ t[3]);
	r[4] ^= mask & (r[4] ^ t[4]);
}